

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-server-close.c
# Opt level: O2

int run_test_pipe_server_close(void)

{
  int iVar1;
  uv_loop_t *loop;
  char *__format;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 uVar6;
  int64_t eval_b;
  int64_t eval_a;
  
  loop = uv_default_loop();
  if (loop == (uv_loop_t *)0x0) {
    pcVar3 = "!=";
    pcVar5 = "!=";
    eval_b = 0;
    eval_a = 0;
    pcVar4 = "NULL";
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
    pcVar2 = "loop";
    uVar6 = 0x47;
  }
  else {
    iVar1 = uv_pipe_init(loop,&pipe_server,0);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      iVar1 = uv_pipe_bind(&pipe_server,"/tmp/uv-test-sock");
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        iVar1 = uv_listen((uv_stream_t *)&pipe_server,0,pipe_server_connection_cb);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          iVar1 = uv_pipe_init(loop,&pipe_client,0);
          eval_a = (int64_t)iVar1;
          eval_b = 0;
          if (eval_a == 0) {
            uv_pipe_connect(&connect_req,&pipe_client,"/tmp/uv-test-sock",pipe_client_connect_cb);
            iVar1 = uv_run(loop,UV_RUN_DEFAULT);
            eval_a = (int64_t)iVar1;
            eval_b = 0;
            if (eval_a == 0) {
              eval_a = 1;
              eval_b = (int64_t)pipe_client_connect_cb_called;
              if (eval_b == 1) {
                eval_a = 2;
                eval_b = (int64_t)pipe_close_cb_called;
                if (eval_b == 2) {
                  uv_walk(loop,close_walk_cb,(void *)0x0);
                  uv_run(loop,UV_RUN_DEFAULT);
                  eval_a = 0;
                  iVar1 = uv_loop_close(loop);
                  eval_b = (int64_t)iVar1;
                  if (eval_b == 0) {
                    uv_library_shutdown();
                    return 0;
                  }
                  pcVar4 = "uv_loop_close(loop)";
                  pcVar2 = "0";
                  uVar6 = 0x5c;
                }
                else {
                  pcVar4 = "pipe_close_cb_called";
                  pcVar2 = "2";
                  uVar6 = 0x5a;
                }
              }
              else {
                pcVar4 = "pipe_client_connect_cb_called";
                pcVar2 = "1";
                uVar6 = 0x59;
              }
            }
            else {
              pcVar4 = "0";
              pcVar2 = "r";
              uVar6 = 0x58;
            }
          }
          else {
            pcVar4 = "0";
            pcVar2 = "r";
            uVar6 = 0x53;
          }
        }
        else {
          pcVar4 = "0";
          pcVar2 = "r";
          uVar6 = 0x50;
        }
      }
      else {
        pcVar4 = "0";
        pcVar2 = "r";
        uVar6 = 0x4d;
      }
    }
    else {
      pcVar4 = "0";
      pcVar2 = "r";
      uVar6 = 0x4a;
    }
    pcVar3 = "==";
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
    pcVar5 = "==";
  }
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-server-close.c"
          ,uVar6,pcVar2,pcVar3,pcVar4,eval_a,pcVar5,eval_b);
  abort();
}

Assistant:

TEST_IMPL(pipe_server_close) {
#if defined(NO_SELF_CONNECT)
  RETURN_SKIP(NO_SELF_CONNECT);
#endif
  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();
  ASSERT_NOT_NULL(loop);

  r = uv_pipe_init(loop, &pipe_server, 0);
  ASSERT_OK(r);

  r = uv_pipe_bind(&pipe_server, TEST_PIPENAME);
  ASSERT_OK(r);

  r = uv_listen((uv_stream_t*) &pipe_server, 0, pipe_server_connection_cb);
  ASSERT_OK(r);

  r = uv_pipe_init(loop, &pipe_client, 0);
  ASSERT_OK(r);

  uv_pipe_connect(&connect_req, &pipe_client, TEST_PIPENAME, pipe_client_connect_cb);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);
  ASSERT_EQ(1, pipe_client_connect_cb_called);
  ASSERT_EQ(2, pipe_close_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}